

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlq.cpp
# Opt level: O1

bool __thiscall
pg::TLQSolver::attractTangle(TLQSolver *this,int t,int pl,bitset *R,bitset *Z,bitset *G)

{
  uint uVar1;
  pointer piVar2;
  undefined1 uVar3;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  
  piVar2 = (this->tpr).super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
           ._M_start;
  uVar1 = piVar2[t];
  if ((uVar1 & 1) == pl && uVar1 != 0xffffffff) {
    uVar5 = (ulong)*(this->tv).super__Vector_base<int_*,_std::allocator<int_*>_>._M_impl.
                    super__Vector_impl_data._M_start[t];
    if (uVar5 != 0xffffffffffffffff) {
      uVar4 = uVar5 >> 6;
      if (((this->G)._bits[uVar4] >> (uVar5 & 0x3f) & 1) != 0) {
        uVar5 = 1L << (uVar5 & 0x3f);
        uVar6 = 3;
        if ((Z->_bits[uVar4] & uVar5) == 0) {
          uVar6 = (ulong)((R->_bits[uVar4] & uVar5) == 0);
        }
        uVar3 = (*(code *)(&DAT_001866e4 + *(int *)(&DAT_001866e4 + uVar6 * 4)))();
        return (bool)uVar3;
      }
      piVar2[t] = -1;
    }
  }
  return false;
}

Assistant:

bool
TLQSolver::attractTangle(int t, const int pl, bitset &R, bitset &Z, bitset &G)
{
    /**
     * Check if tangle is won by player <pl> and not deleted
     */
    {
        const int tangle_pr = tpr[t];
        if (tangle_pr == -1) return false; // deleted tangle
        if (pl != (tangle_pr&1)) return false; // not of desired parity
    }

    /**
     * Check if tangle is contained in Z+R and if any vertices are not already in Z
     * We require at least one vertex in Z\R. Otherwise, don´t attract.
     */
    {
        bool can_attract_new = false;
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            ptr++; // skip strategy
            if (!this->G[v]) {
                // on-the-fly detect out-of-game tangles
                tpr[t] = -1; // delete the tangle
                return false; // is now a deleted tangle
            } else if (Z[v]) {
                continue; // already attracted
            } else if (!R[v]) {
                return false; // not contained in Z+R
            } else {
                can_attract_new = true; // has vertices not yet attracted
            }
        }
        if (!can_attract_new) return false; // either no vertices in R\Z or strategy leaves R+Z
    }

    /**
     * Check if the tangle can escape to G\Z.
     */
    {
        int *ptr = tout[t];
        int v;
        while ((v=*ptr++) != -1) {
            if (Z[v]) continue;
            if (G[v]) return false; // opponent escapes
        }
    }

    /**
     * Attract!
     */
    {
        int *ptr = tv[t];
        for (;;) {
            const int v = *ptr++;
            if (v == -1) break;
            const int s = *ptr++;
            if (Z[v]) continue; // already in <Z>
            Z[v] = true;
            str[v] = s;
            Q.push(v);

#ifndef NDEBUG
            // maybe report event
            if (trace >= 3) {
                logger << "\033[1;37mattracted \033[36m" << label_vertex(v) << "\033[m by \033[1;36m" << pl << "\033[m";
                logger << " (via tangle " << t << ")" << std::endl;
            }
#endif
        }
    }

    return true;
}